

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::eventsChecker::ZEeventsChecker::zeEventDestroyEpilogue
          (ZEeventsChecker *this,ze_event_handle_t hEvent,ze_result_t result)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  ze_event_handle_t local_10;
  
  if (result == ZE_RESULT_SUCCESS) {
    uVar1 = (this->eventToDagID)._M_h._M_bucket_count;
    uVar3 = (ulong)hEvent % uVar1;
    p_Var4 = (this->eventToDagID)._M_h._M_buckets[uVar3];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var4 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4,
       (ze_event_handle_t)p_Var4->_M_nxt[1]._M_nxt != hEvent)) {
      while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
           (p_Var5 = p_Var4, (ze_event_handle_t)p_Var2[1]._M_nxt == hEvent)) goto LAB_001acb72;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_001acb72:
    if ((p_Var5 != (__node_base_ptr)0x0) && (p_Var5->_M_nxt != (_Hash_node_base *)0x0)) {
      local_10 = hEvent;
      std::
      _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->eventToDagID)._M_h,&local_10);
    }
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
eventsChecker::ZEeventsChecker::zeEventDestroyEpilogue(
    ze_event_handle_t hEvent, ///< [in][release] handle of event object to destroy
    ze_result_t result
) {
    if(result != ZE_RESULT_SUCCESS) {
        return ZE_RESULT_SUCCESS;
    }

    if (eventToDagID.find(hEvent) != eventToDagID.end()) {
        // Delete event from eventToDagID but not from the dagIDToAction map as it may be needed for printing the discription of the action when printing path in the DAG.
        eventToDagID.erase(hEvent);
    }

    return ZE_RESULT_SUCCESS;
}